

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall TPZMatrix<int>::MatrixNorm(TPZMatrix<int> *this,int p,int64_t numiter,REAL tol)

{
  long size;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  ulong uVar6;
  long lVar7;
  int sum;
  long lVar8;
  long lVar9;
  double dVar10;
  TPZVec<int> ROW;
  TPZVec<int> EigenVal;
  TPZFMatrix<int> transp;
  REAL local_110;
  int64_t local_108;
  TPZVec<int> local_100;
  TPZVec<int> local_e0;
  TPZFMatrix<int> local_c0;
  
  size = (this->super_TPZBaseMatrix).fRow;
  iVar3 = 0;
  if (size != 0) {
    local_110 = tol;
    local_108 = numiter;
    if (size != (this->super_TPZBaseMatrix).fCol) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "TVar TPZMatrix<int>::MatrixNorm(int, int64_t, REAL) const [T = int]",0x43);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," - matrix must be square - Rows() = ",0x24);
      poVar5 = std::ostream::_M_insert<long>((long)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," - Cols() = ",0xc);
      poVar5 = std::ostream::_M_insert<long>((long)poVar5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    if (p == 0) {
      iVar3 = 0;
      if (0 < size) {
        lVar8 = 0;
        iVar3 = 0;
        do {
          dVar10 = 0.0;
          lVar7 = 0;
          do {
            iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                              (this,lVar8,lVar7);
            dVar10 = dVar10 + ABS((double)iVar2);
            lVar7 = lVar7 + 1;
          } while (size != lVar7);
          if (ABS((double)iVar3) < dVar10) {
            iVar3 = (int)dVar10;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != size);
      }
    }
    else if (p == 2) {
      local_c0.super_TPZMatrix<int>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_c0.super_TPZMatrix<int>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_c0.super_TPZMatrix<int>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_01859e90;
      local_c0.fElem = (int *)0x0;
      local_c0.fGiven = (int *)0x0;
      local_c0.fSize = 0;
      local_c0.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow = size;
      local_c0.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol = size;
      TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
      local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
      local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
      local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
      local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
      local_c0.fWork.fStore = (int *)0x0;
      local_c0.fWork.fNElements = 0;
      local_c0.fWork.fNAlloc = 0;
      uVar6 = 0xffffffffffffffff;
      if ((ulong)(size * size) >> 0x3e == 0) {
        uVar6 = size * size * 4;
      }
      local_c0.fElem = (int *)operator_new__(uVar6);
      if (0 < size) {
        lVar8 = 0;
        do {
          lVar7 = 0;
          do {
            iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                              (this,lVar7,lVar8);
            if ((local_c0.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow <= lVar8) ||
               (local_c0.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol <= lVar7)) {
              TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            local_c0.fElem[local_c0.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow * lVar7 + lVar8] =
                 iVar3;
            lVar7 = lVar7 + 1;
          } while (size != lVar7);
          lVar8 = lVar8 + 1;
        } while (lVar8 != size);
      }
      TPZVec<int>::TPZVec(&local_100,size);
      if (0 < size) {
        lVar8 = 0;
        do {
          lVar7 = 0;
          do {
            if ((local_c0.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow <= lVar8) ||
               (local_c0.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol <= lVar7)) {
              TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            local_100.fStore[lVar7] =
                 local_c0.fElem
                 [local_c0.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow * lVar7 + lVar8];
            lVar7 = lVar7 + 1;
          } while (size != lVar7);
          lVar7 = 0;
          do {
            iVar3 = 0;
            lVar9 = 0;
            do {
              iVar2 = local_100.fStore[lVar9];
              iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                                (this,lVar9,lVar7);
              iVar3 = iVar3 + iVar4 * iVar2;
              lVar9 = lVar9 + 1;
            } while (size != lVar9);
            if ((local_c0.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow <= lVar8) ||
               (local_c0.super_TPZMatrix<int>.super_TPZBaseMatrix.fCol <= lVar7)) {
              TPZFMatrix<int>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            local_c0.fElem[local_c0.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow * lVar7 + lVar8] =
                 iVar3;
            lVar7 = lVar7 + 1;
          } while (lVar7 != size);
          lVar8 = lVar8 + 1;
        } while (lVar8 != size);
      }
      local_e0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
      local_e0.fStore = (int *)0x0;
      local_e0.fNElements = 0;
      local_e0.fNAlloc = 0;
      bVar1 = SolveEigenvaluesJacobi(&local_c0.super_TPZMatrix<int>,&local_108,&local_110,&local_e0)
      ;
      if (!bVar1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "TVar TPZMatrix<int>::MatrixNorm(int, int64_t, REAL) const [T = int]",0x43);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr," - it was not possible to find Eigenvalues. Iterations = "
                   ,0x39);
        poVar5 = std::ostream::_M_insert<long>((long)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," - error found = ",0x11);
        poVar5 = std::ostream::_M_insert<double>(local_110);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      dVar10 = (double)*local_e0.fStore;
      if (dVar10 < 0.0) {
        dVar10 = sqrt(dVar10);
      }
      else {
        dVar10 = SQRT(dVar10);
      }
      local_e0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
      if (local_e0.fStore != (int *)0x0) {
        operator_delete__(local_e0.fStore);
      }
      local_100._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
      if (local_100.fStore != (int *)0x0) {
        operator_delete__(local_100.fStore);
      }
      TPZFMatrix<int>::~TPZFMatrix(&local_c0);
      iVar3 = (int)dVar10;
    }
    else if (p == 1) {
      if (0 < size) {
        lVar8 = 0;
        iVar3 = 0;
        do {
          dVar10 = 0.0;
          lVar7 = 0;
          do {
            iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                              (this,lVar7,lVar8);
            dVar10 = dVar10 + ABS((double)iVar2);
            lVar7 = lVar7 + 1;
          } while (size != lVar7);
          if (ABS((double)iVar3) < dVar10) {
            iVar3 = (int)dVar10;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != size);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "TVar TPZMatrix<int>::MatrixNorm(int, int64_t, REAL) const [T = int]",0x43);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," p = ",5);
      poVar5 = (ostream *)std::ostream::operator<<(&std::cerr,p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," is not a correct option",0x18);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
  }
  return iVar3;
}

Assistant:

TVar TPZMatrix<TVar>::MatrixNorm(int p, int64_t numiter, REAL tol) const{
	const int64_t n = this->Rows();
	if (!n) return 0.;
	if (n != this->Cols()){
		PZError << __PRETTY_FUNCTION__
		<< " - matrix must be square - Rows() = "
		<< this->Rows() << " - Cols() = "
		<< this->Cols() << std::endl;
	}
	switch(p){
		case 0:{
			TVar max = 0.;
			int64_t i, j;
			for(i = 0; i < n; i++){
				REAL sum = 0.;
				for(j = 0; j < n; j++) sum += fabs( this->Get(i,j) );
				if (sum > fabs(max)) max = sum;
			}
			return max;
		}
		case 1:{
			TVar max = 0.;
			int64_t i, j;
			for(i = 0; i < n; i++){
				REAL sum = 0.;
				for(j = 0; j < n; j++) sum += fabs( this->Get(j,i) );
				if (sum > fabs(max)) max = sum;
			}
			return max;
		}
		case 2:{
			TPZFMatrix<TVar> transp(n,n);
			int64_t i, j, k;
			//TRANSPOSE
			for(i = 0; i < n; i++) for(j = 0; j < n; j++) transp(i,j) = this->Get(j,i);
			//MULTIPLY transp = transp.this
			TPZVec<TVar> ROW(n);
			for(i = 0; i < n; i++){
				for(j = 0; j < n; j++) ROW[j] = transp(i,j);
				for(j = 0; j < n; j++){
					TVar sum = 0.;
					for(k = 0; k < n; k++){
						sum += ROW[k] * this->Get(k,j);
					}//for k
					transp(i,j) = sum;
				}//for j
			}//for i
			
			TPZVec<TVar> EigenVal;
			bool result = transp.SolveEigenvaluesJacobi(numiter, tol, &EigenVal);
			if (result == false) PZError << __PRETTY_FUNCTION__
				<< " - it was not possible to find Eigenvalues. Iterations = "
				<< numiter << " - error found = " << tol << std::endl;
			return sqrt(EigenVal[0]);
		}//case 2
		default:{
			PZError << __PRETTY_FUNCTION__ << " p = " << p << " is not a correct option" << std::endl;
		}
	}//switch
	return 0.;
}